

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint32_t __thiscall AmpIO::GetAnalogInput(AmpIO *this,uint index)

{
  quadlet_t buff;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    this_local._4_4_ = this->ReadBuffer[index + 4] >> 0x10;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t AmpIO::GetAnalogInput(unsigned int index) const
{
    // Checking against NumMotors is correct because the analog input (e.g., pot) is in the same
    // quadlet as the motor current feedback. Logically, it would have made more sense to use
    // NumEncoders, since the number of pots would likely match the number of encoders.
    if (index >= NumMotors)
        return 0L;

    quadlet_t buff;
    buff = ReadBuffer[index+ANALOG_POS_OFFSET];
    buff &= ANALOG_POS_MASK;       // mask for applicable bits
    buff >>= 16;                   // shift to lsb alignment

    return static_cast<uint32_t>(buff) & ADC_MASK;
}